

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader-network.cc
# Opt level: O3

bool __thiscall
tinyusdz::tydra::DirectBindingStrongerThanDescendants
          (tydra *this,Stage *_stage,Prim *prim,string *purpose)

{
  bool bVar1;
  undefined1 local_30 [16];
  undefined1 local_20 [16];
  
  local_30._8_8_ = 0;
  local_20._8_8_ =
       ::std::
       _Function_handler<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::MaterialBinding_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/shader-network.cc:287:20)>
       ::_M_invoke;
  local_20._0_8_ =
       ::std::
       _Function_handler<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::MaterialBinding_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/shader-network.cc:287:20)>
       ::_M_manager;
  local_30._0_8_ = prim;
  bVar1 = ApplyToMaterialBinding
                    (this,_stage,(Prim *)local_30,
                     (function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::MaterialBinding_*)> *)
                     purpose);
  if ((code *)local_20._0_8_ != (code *)0x0) {
    (*(code *)local_20._0_8_)(local_30,local_30,3);
  }
  return bVar1;
}

Assistant:

bool DirectBindingStrongerThanDescendants(
  const Stage &_stage,
  const Prim &prim,
  const std::string &purpose)
{
  auto apply_fun = [&](const Stage &stage, const MaterialBinding *mb) -> bool {

    (void)stage;

    Relationship mat_rel;
    if (!mb->get_materialBinding(value::token(purpose), &mat_rel)) {
      return false;
    }

    const value::token strength = mat_rel.metas().bindMaterialAs.value_or(kWeaderThanDescendants);
    return strength.str() == kStrongerThanDescendants;

  };

  bool ret = ApplyToMaterialBinding(_stage, prim, apply_fun);

  return ret;
}